

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int get_big_cpu_data_cache_size(int level)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = ncnn::CpuSet::num_enabled(&g_cpu_affinity_mask_big);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    uVar2 = (ulong)(uint)g_cpucount;
    if (g_cpucount < 1) {
      uVar2 = 0;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if ((uVar3 < 0x400) &&
         ((g_cpu_affinity_mask_big.cpu_set.__bits[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0)) {
        iVar1 = (int)uVar3;
        break;
      }
    }
  }
  iVar1 = get_data_cache_size(iVar1,level);
  return iVar1;
}

Assistant:

static int get_big_cpu_data_cache_size(int level)
{
    if (g_cpu_affinity_mask_big.num_enabled() == 0)
    {
        // smp cpu
        return get_data_cache_size(0, level);
    }

    for (int i = 0; i < g_cpucount; i++)
    {
        if (g_cpu_affinity_mask_big.is_enabled(i))
        {
            return get_data_cache_size(i, level);
        }
    }

    // should never reach here, fallback to cpu0
    return get_data_cache_size(0, level);
}